

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  size_t argumentNode;
  sysbvm_bitflags_t sVar2;
  size_t slotCount;
  sysbvm_tuple_t sVar3;
  bool bVar4;
  ulong local_200;
  size_t local_1f8;
  size_t i_1;
  size_t i;
  size_t sourceArgumentIndex;
  size_t applicationArgumentCount;
  size_t directEvaluationArgumentNodeCount;
  _Bool isVariadic;
  sysbvm_bitflags_t flags;
  size_t argumentNodeCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord;
  anon_struct_72_9_80492c42 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_dependentFunctionType_t **dependentFunctionType;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  gcFrame.expectedArgumentType = (sysbvm_tuple_t)(arguments + 2);
  memset(functionActivationRecord.jmpbuffer[0].__saved_mask.__val + 0xf,0,0x48);
  functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] = arguments[1];
  memset(&gcFrameRecord.roots,0,0xf8);
  functionActivationRecord.previous._0_4_ = 1;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&gcFrameRecord.roots);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_COUNT;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val + 0xf)
  ;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  argumentNodeCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ =
       *(undefined8 *)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&argumentNodeCount);
  gcFrame.functionApplicationNode =
       (sysbvm_astFunctionApplicationNode_t *)
       sysbvm_functionActivationEnvironment_createForDependentFunctionType(context,0,*arguments);
  argumentNode = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x108));
  sVar2 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(*arguments + 0xf8));
  bVar4 = (sVar2 & 2) != 0;
  if ((bVar4) && (argumentNode == 0)) {
    sysbvm_error("Variadic functions at least one extra argument node.");
  }
  local_200 = argumentNode;
  if (bVar4) {
    local_200 = argumentNode - 1;
  }
  slotCount = sysbvm_array_getSize
                        (*(sysbvm_tuple_t *)
                          (functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x30));
  i = 0;
  gcFrame.analyzedArgument = sysbvm_array_create(context,slotCount);
  for (i_1 = 0; i_1 < local_200; i_1 = i_1 + 1) {
    gcFrame.applicationEnvironment = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x108),i_1);
    _Var1 = sysbvm_astArgumentNode_isForAll(argumentNode);
    if (_Var1) {
      sysbvm_error("TODO: Support forall argument types");
    }
    else {
      if (slotCount <= i) {
        sysbvm_error("Function application is missing required arguments.");
      }
      gcFrame.argumentNode =
           sysbvm_array_at(*(sysbvm_tuple_t *)
                            (functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x30),i
                          );
      gcFrame.analyzedArguments =
           sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment
                     (context,gcFrame.applicationEnvironment,(sysbvm_tuple_t *)&gcFrame);
      gcFrame.resultType =
           sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                     (context,gcFrame.argumentNode,gcFrame.analyzedArguments,
                      *(sysbvm_tuple_t *)gcFrame.expectedArgumentType);
      sysbvm_array_atPut(gcFrame.analyzedArgument,i,gcFrame.resultType);
      gcFrame.applicationArgumentNode =
           sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode
                     (context,gcFrame.resultType);
      sysbvm_interpreter_bindArgumentNodeValueInEnvironment
                (context,i_1,(sysbvm_tuple_t *)&gcFrame,gcFrame.applicationArgumentNode);
      i = i + 1;
    }
  }
  if ((!bVar4) && (i != slotCount)) {
    sysbvm_error("Function application is not receiving the expected number of arguments.");
  }
  for (local_1f8 = i; local_1f8 < slotCount; local_1f8 = local_1f8 + 1) {
    gcFrame.argumentNode =
         sysbvm_array_at(*(sysbvm_tuple_t *)
                          (functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x30),
                         local_1f8);
    gcFrame.resultType =
         sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                   (context,gcFrame.argumentNode,*(sysbvm_tuple_t *)gcFrame.expectedArgumentType);
    sysbvm_array_atPut(gcFrame.analyzedArgument,local_1f8,gcFrame.resultType);
  }
  *(sysbvm_tuple_t *)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x30) =
       gcFrame.analyzedArgument;
  if (*(long *)(*arguments + 0x110) != 0) {
    gcFrame.applicationArgumentValue =
         sysbvm_interpreter_evaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*arguments + 0x110),
                    (sysbvm_tuple_t)gcFrame.functionApplicationNode);
  }
  gcFrame.applicationArgumentValue =
       sysbvm_type_canonicalizeDependentResultType(context,gcFrame.applicationArgumentValue);
  sVar2 = sysbvm_tuple_bitflags_decode
                    (*(sysbvm_tuple_t *)
                      (functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x38));
  sVar3 = sysbvm_tuple_bitflags_encode(sVar2 | 3);
  *(sysbvm_tuple_t *)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x38) = sVar3;
  *(sysbvm_tuple_t *)(functionActivationRecord.jmpbuffer[0].__saved_mask.__val[0xf] + 0x20) =
       gcFrame.applicationArgumentValue;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&argumentNodeCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&gcFrameRecord.roots);
  sVar3 = sysbvm_astFunctionApplicationNode_optimizePureApplication
                    (context,(sysbvm_astFunctionApplicationNode_t **)(arguments + 1));
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_dependentFunctionType_t **dependentFunctionType = (sysbvm_dependentFunctionType_t **)&arguments[0];
    sysbvm_tuple_t *node = &arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    struct {
        sysbvm_astFunctionApplicationNode_t *functionApplicationNode;

        sysbvm_tuple_t applicationEnvironment;
        sysbvm_tuple_t argumentNode;

        sysbvm_tuple_t applicationArgumentNode;
        sysbvm_tuple_t applicationArgumentValue;
        sysbvm_tuple_t resultType;

        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        sysbvm_tuple_t expectedArgumentType;
    } gcFrame = {
        .functionApplicationNode = (sysbvm_astFunctionApplicationNode_t*)*node,
    };

    sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord); 
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.functionApplicationNode->super.sourcePosition);

    gcFrame.applicationEnvironment = sysbvm_functionActivationEnvironment_createForDependentFunctionType(context, SYSBVM_NULL_TUPLE, (sysbvm_tuple_t)*dependentFunctionType);

    size_t argumentNodeCount = sysbvm_array_getSize((*dependentFunctionType)->argumentNodes);
    sysbvm_bitflags_t flags = sysbvm_tuple_bitflags_decode((*dependentFunctionType)->super.functionFlags);
    bool isVariadic = (flags & SYSBVM_FUNCTION_FLAGS_VARIADIC) != 0;
    if(isVariadic && argumentNodeCount == 0)
        sysbvm_error("Variadic functions at least one extra argument node.");
    
    size_t directEvaluationArgumentNodeCount = isVariadic ? argumentNodeCount - 1 : argumentNodeCount;

    size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.functionApplicationNode->arguments);
    size_t sourceArgumentIndex = 0;

    gcFrame.analyzedArguments = sysbvm_array_create(context, applicationArgumentCount);
    for(size_t i = 0; i < directEvaluationArgumentNodeCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*dependentFunctionType)->argumentNodes, i);
        if(sysbvm_astArgumentNode_isForAll(argumentNodeCount))
        {
            sysbvm_error("TODO: Support forall argument types");
        }
        else
        {
            if(sourceArgumentIndex >= applicationArgumentCount)
                sysbvm_error("Function application is missing required arguments.");

            gcFrame.applicationArgumentNode = sysbvm_array_at(gcFrame.functionApplicationNode->arguments, sourceArgumentIndex);
            gcFrame.expectedArgumentType = sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment(context, gcFrame.argumentNode, &gcFrame.applicationEnvironment);
            gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.applicationArgumentNode, gcFrame.expectedArgumentType, *environment);
            sysbvm_array_atPut(gcFrame.analyzedArguments, sourceArgumentIndex, gcFrame.analyzedArgument);
            gcFrame.applicationArgumentValue = sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode(context, gcFrame.analyzedArgument);
            sysbvm_interpreter_bindArgumentNodeValueInEnvironment(context, i, &gcFrame.applicationEnvironment, gcFrame.applicationArgumentValue);
            ++sourceArgumentIndex;
        }
    }

    if(!isVariadic && sourceArgumentIndex != applicationArgumentCount)
        sysbvm_error("Function application is not receiving the expected number of arguments.");

    for(size_t i = sourceArgumentIndex; i < applicationArgumentCount; ++i)
    {
        gcFrame.applicationArgumentNode = sysbvm_array_at(gcFrame.functionApplicationNode->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.applicationArgumentNode, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    gcFrame.functionApplicationNode->arguments = gcFrame.analyzedArguments;

    if((*dependentFunctionType)->resultTypeNode)
        gcFrame.resultType = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*dependentFunctionType)->resultTypeNode, gcFrame.applicationEnvironment);
    gcFrame.resultType = sysbvm_type_canonicalizeDependentResultType(context, gcFrame.resultType);
    gcFrame.functionApplicationNode->applicationFlags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode(gcFrame.functionApplicationNode->applicationFlags)
        | SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);
    gcFrame.functionApplicationNode->super.analyzedType = gcFrame.resultType;

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord);  
    return sysbvm_astFunctionApplicationNode_optimizePureApplication(context, (sysbvm_astFunctionApplicationNode_t**)node);
}